

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

bool __thiscall
om::file::simple_binary_reader<test_format>::next
          (simple_binary_reader<test_format> *this,test_format *t_)

{
  bool bVar1;
  reference ptVar2;
  __normal_iterator<const_test_format_*,_std::vector<test_format,_std::allocator<test_format>_>_>
  local_20;
  test_format *local_18;
  test_format *t__local;
  simple_binary_reader<test_format> *this_local;
  
  local_18 = t_;
  t__local = (test_format *)this;
  if ((this->_use_buffer & 1U) == 0) {
    std::istream::read((char *)&(this->super__file_stream)._stream,(long)t_);
  }
  else {
    local_20 = __gnu_cxx::
               __normal_iterator<const_test_format_*,_std::vector<test_format,_std::allocator<test_format>_>_>
               ::operator++(&this->_iter,0);
    ptVar2 = __gnu_cxx::
             __normal_iterator<const_test_format_*,_std::vector<test_format,_std::allocator<test_format>_>_>
             ::operator*(&local_20);
    *local_18 = *ptVar2;
  }
  bVar1 = done(this);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool next(T& t_)
			{
				if (_use_buffer)
					t_ = *(_iter++);
				else
					_stream.read((char*) &t_, sizeof(T));

				return !done();
			}